

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined4 uVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined4 uVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  int iVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  long lVar76;
  uint uVar77;
  ulong *puVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  GridMesh *mesh;
  undefined4 uVar84;
  ulong unaff_R13;
  size_t mask;
  long lVar85;
  ulong uVar86;
  long lVar87;
  bool bVar88;
  bool bVar89;
  float fVar90;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar110 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  float fVar138;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar146;
  undefined1 auVar141 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar156;
  uint uVar157;
  float fVar161;
  uint uVar162;
  float fVar163;
  uint uVar164;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar165;
  uint uVar166;
  float fVar167;
  uint uVar168;
  float fVar169;
  uint uVar170;
  float fVar171;
  uint uVar172;
  undefined1 auVar160 [32];
  uint uVar173;
  float fVar174;
  float fVar177;
  float fVar178;
  undefined1 auVar175 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar176 [32];
  float fVar183;
  undefined1 auVar184 [32];
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar185 [64];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar196 [32];
  float fVar203;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar204 [32];
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [564];
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined1 (*local_16b0) [16];
  ulong local_16a8;
  ulong local_16a0;
  ulong local_1698;
  ulong local_1690;
  ulong local_1688;
  ulong local_1680;
  ulong local_1678;
  ulong *local_1670;
  ulong *local_1668;
  ulong local_1660;
  ulong local_1658;
  ulong local_1650;
  ulong local_1648;
  ulong local_1640;
  ulong local_1638;
  ulong local_1630;
  ulong local_1628;
  ulong local_1620;
  ulong local_1618;
  long local_1610;
  long local_1608;
  undefined1 local_1600 [16];
  undefined1 auStack_15f0 [16];
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [16];
  undefined1 auStack_1590 [16];
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float fStack_1564;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [16];
  undefined1 auStack_14d0 [16];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  float local_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float local_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float local_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined1 local_13f0 [16];
  uint local_13e0;
  uint uStack_13dc;
  uint uStack_13d8;
  uint uStack_13d4;
  uint uStack_13d0;
  uint uStack_13cc;
  uint uStack_13c8;
  uint uStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1320 [32];
  float local_1300 [4];
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined1 local_1240 [8];
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar84 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1500._4_4_ = uVar84;
  local_1500._0_4_ = uVar84;
  local_1500._8_4_ = uVar84;
  local_1500._12_4_ = uVar84;
  local_1500._16_4_ = uVar84;
  local_1500._20_4_ = uVar84;
  local_1500._24_4_ = uVar84;
  local_1500._28_4_ = uVar84;
  auVar185 = ZEXT3264(local_1500);
  uVar84 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1520._4_4_ = uVar84;
  local_1520._0_4_ = uVar84;
  local_1520._8_4_ = uVar84;
  local_1520._12_4_ = uVar84;
  local_1520._16_4_ = uVar84;
  local_1520._20_4_ = uVar84;
  local_1520._24_4_ = uVar84;
  local_1520._28_4_ = uVar84;
  auVar193 = ZEXT3264(local_1520);
  uVar84 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1540._4_4_ = uVar84;
  local_1540._0_4_ = uVar84;
  local_1540._8_4_ = uVar84;
  local_1540._12_4_ = uVar84;
  local_1540._16_4_ = uVar84;
  local_1540._20_4_ = uVar84;
  local_1540._24_4_ = uVar84;
  local_1540._28_4_ = uVar84;
  auVar195 = ZEXT3264(local_1540);
  fVar90 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar80 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar81 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar82 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar83 = uVar80 ^ 0x20;
  uVar73 = uVar81 ^ 0x20;
  uVar86 = uVar82 ^ 0x20;
  iVar72 = (tray->tnear).field_0.i[k];
  local_14a0._4_4_ = iVar72;
  local_14a0._0_4_ = iVar72;
  local_14a0._8_4_ = iVar72;
  local_14a0._12_4_ = iVar72;
  local_14a0._16_4_ = iVar72;
  local_14a0._20_4_ = iVar72;
  local_14a0._24_4_ = iVar72;
  local_14a0._28_4_ = iVar72;
  auVar133 = ZEXT3264(local_14a0);
  iVar72 = (tray->tfar).field_0.i[k];
  local_14c0._4_4_ = iVar72;
  local_14c0._0_4_ = iVar72;
  local_14c0._8_4_ = iVar72;
  local_14c0._12_4_ = iVar72;
  local_14c0._16_4_ = iVar72;
  local_14c0._20_4_ = iVar72;
  local_14c0._24_4_ = iVar72;
  local_14c0._28_4_ = iVar72;
  auVar137 = ZEXT3264(local_14c0);
  local_1638 = uVar80 >> 2;
  local_1220._0_16_ = mm_lookupmask_ps._0_16_;
  local_1220._16_16_ = mm_lookupmask_ps._240_16_;
  local_16b0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1640 = uVar83 >> 2;
  local_1648 = uVar81 >> 2;
  local_1650 = uVar73 >> 2;
  local_1658 = uVar82 >> 2;
  local_1660 = uVar86 >> 2;
  auVar104._8_4_ = 0xbf800000;
  auVar104._0_8_ = 0xbf800000bf800000;
  auVar104._12_4_ = 0xbf800000;
  auVar104._16_4_ = 0xbf800000;
  auVar104._20_4_ = 0xbf800000;
  auVar104._24_4_ = 0xbf800000;
  auVar104._28_4_ = 0xbf800000;
  auVar113._8_4_ = 0x3f800000;
  auVar113._0_8_ = &DAT_3f8000003f800000;
  auVar113._12_4_ = 0x3f800000;
  auVar113._16_4_ = 0x3f800000;
  auVar113._20_4_ = 0x3f800000;
  auVar113._24_4_ = 0x3f800000;
  auVar113._28_4_ = 0x3f800000;
  _local_1240 = vblendvps_avx(auVar113,auVar104,local_1220);
  puVar78 = local_11f8;
  fVar96 = fVar95;
  fVar98 = fVar95;
  fVar100 = fVar95;
  fVar97 = fVar95;
  fVar99 = fVar95;
  fVar93 = fVar95;
  fVar197 = fVar90;
  fVar198 = fVar90;
  fVar199 = fVar90;
  fVar200 = fVar90;
  fVar201 = fVar90;
  fVar202 = fVar90;
  fVar205 = fVar94;
  fVar207 = fVar94;
  fVar209 = fVar94;
  fVar211 = fVar94;
  fVar213 = fVar94;
  fVar215 = fVar94;
  local_16a8 = uVar86;
  local_16a0 = uVar73;
  local_1698 = uVar83;
  local_1690 = uVar82;
  local_1688 = uVar81;
  local_1680 = uVar80;
  local_1580 = fVar94;
  fStack_157c = fVar94;
  fStack_1578 = fVar94;
  fStack_1574 = fVar94;
  fStack_1570 = fVar94;
  fStack_156c = fVar94;
  fStack_1568 = fVar94;
  fStack_1564 = fVar94;
  local_1560 = fVar90;
  fStack_155c = fVar90;
  fStack_1558 = fVar90;
  fStack_1554 = fVar90;
  fStack_1550 = fVar90;
  fStack_154c = fVar90;
  fStack_1548 = fVar90;
  fStack_1544 = fVar90;
  local_1480 = fVar95;
  fStack_147c = fVar95;
  fStack_1478 = fVar95;
  fStack_1474 = fVar95;
  fStack_1470 = fVar95;
  fStack_146c = fVar95;
  fStack_1468 = fVar95;
  fStack_1464 = fVar95;
  do {
    local_1670 = puVar78;
    if (puVar78 == &local_1200) break;
    local_1668 = puVar78 + -1;
    uVar71 = puVar78[-1];
    local_1678 = unaff_R13;
    do {
      if ((uVar71 & 8) == 0) {
        auVar104 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar80),auVar185._0_32_);
        auVar7._4_4_ = fVar197 * auVar104._4_4_;
        auVar7._0_4_ = fVar90 * auVar104._0_4_;
        auVar7._8_4_ = fVar198 * auVar104._8_4_;
        auVar7._12_4_ = fVar199 * auVar104._12_4_;
        auVar7._16_4_ = fVar200 * auVar104._16_4_;
        auVar7._20_4_ = fVar201 * auVar104._20_4_;
        auVar7._24_4_ = fVar202 * auVar104._24_4_;
        auVar7._28_4_ = auVar104._28_4_;
        auVar104 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar81),auVar193._0_32_);
        auVar39._4_4_ = fVar205 * auVar104._4_4_;
        auVar39._0_4_ = fVar94 * auVar104._0_4_;
        auVar39._8_4_ = fVar207 * auVar104._8_4_;
        auVar39._12_4_ = fVar209 * auVar104._12_4_;
        auVar39._16_4_ = fVar211 * auVar104._16_4_;
        auVar39._20_4_ = fVar213 * auVar104._20_4_;
        auVar39._24_4_ = fVar215 * auVar104._24_4_;
        auVar39._28_4_ = auVar104._28_4_;
        auVar104 = vmaxps_avx(auVar7,auVar39);
        auVar113 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar82),auVar195._0_32_);
        auVar40._4_4_ = fVar96 * auVar113._4_4_;
        auVar40._0_4_ = fVar95 * auVar113._0_4_;
        auVar40._8_4_ = fVar98 * auVar113._8_4_;
        auVar40._12_4_ = fVar100 * auVar113._12_4_;
        auVar40._16_4_ = fVar97 * auVar113._16_4_;
        auVar40._20_4_ = fVar99 * auVar113._20_4_;
        auVar40._24_4_ = fVar93 * auVar113._24_4_;
        auVar40._28_4_ = auVar113._28_4_;
        auVar113 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar83),auVar185._0_32_);
        auVar41._4_4_ = fVar197 * auVar113._4_4_;
        auVar41._0_4_ = fVar90 * auVar113._0_4_;
        auVar41._8_4_ = fVar198 * auVar113._8_4_;
        auVar41._12_4_ = fVar199 * auVar113._12_4_;
        auVar41._16_4_ = fVar200 * auVar113._16_4_;
        auVar41._20_4_ = fVar201 * auVar113._20_4_;
        auVar41._24_4_ = fVar202 * auVar113._24_4_;
        auVar41._28_4_ = auVar113._28_4_;
        auVar113 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar73),auVar193._0_32_);
        auVar42._4_4_ = fVar205 * auVar113._4_4_;
        auVar42._0_4_ = fVar94 * auVar113._0_4_;
        auVar42._8_4_ = fVar207 * auVar113._8_4_;
        auVar42._12_4_ = fVar209 * auVar113._12_4_;
        auVar42._16_4_ = fVar211 * auVar113._16_4_;
        auVar42._20_4_ = fVar213 * auVar113._20_4_;
        auVar42._24_4_ = fVar215 * auVar113._24_4_;
        auVar42._28_4_ = auVar113._28_4_;
        auVar7 = vminps_avx(auVar41,auVar42);
        auVar113 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar86),auVar195._0_32_);
        auVar43._4_4_ = fVar96 * auVar113._4_4_;
        auVar43._0_4_ = fVar95 * auVar113._0_4_;
        auVar43._8_4_ = fVar98 * auVar113._8_4_;
        auVar43._12_4_ = fVar100 * auVar113._12_4_;
        auVar43._16_4_ = fVar97 * auVar113._16_4_;
        auVar43._20_4_ = fVar99 * auVar113._20_4_;
        auVar43._24_4_ = fVar93 * auVar113._24_4_;
        auVar43._28_4_ = auVar113._28_4_;
        auVar113 = vmaxps_avx(auVar40,auVar133._0_32_);
        auVar104 = vmaxps_avx(auVar104,auVar113);
        auVar113 = vminps_avx(auVar43,auVar137._0_32_);
        auVar113 = vminps_avx(auVar7,auVar113);
        auVar104 = vcmpps_avx(auVar104,auVar113,2);
        uVar84 = vmovmskps_avx(auVar104);
        local_1678 = CONCAT44((int)(local_1678 >> 0x20),uVar84);
      }
      if ((uVar71 & 8) == 0) {
        if (local_1678 == 0) {
          uVar68 = 4;
        }
        else {
          uVar70 = uVar71 & 0xfffffffffffffff0;
          lVar69 = 0;
          if (local_1678 != 0) {
            for (; (local_1678 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
            }
          }
          uVar68 = 0;
          uVar71 = *(ulong *)(uVar70 + lVar69 * 8);
          uVar75 = local_1678 - 1 & local_1678;
          if (uVar75 != 0) {
            *local_1668 = uVar71;
            lVar69 = 0;
            if (uVar75 != 0) {
              for (; (uVar75 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
              }
            }
            uVar71 = *(ulong *)(uVar70 + lVar69 * 8);
            for (uVar75 = uVar75 - 1 & uVar75; local_1668 = local_1668 + 1, uVar75 != 0;
                uVar75 = uVar75 & uVar75 - 1) {
              *local_1668 = uVar71;
              lVar69 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                }
              }
              uVar71 = *(ulong *)(uVar70 + lVar69 * 8);
            }
          }
        }
      }
      else {
        uVar68 = 6;
      }
    } while (uVar68 == 0);
    if (uVar68 == 6) {
      local_1630 = (ulong)((uint)uVar71 & 0xf) - 8;
      bVar88 = local_1630 != 0;
      if (bVar88) {
        uVar71 = uVar71 & 0xfffffffffffffff0;
        local_1628 = 0;
        do {
          lVar69 = local_1628 * 0x90;
          local_1608 = uVar71 + lVar69;
          auVar111._8_8_ = 0;
          auVar111._0_8_ = *(ulong *)(uVar71 + 0x40 + lVar69);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = *(ulong *)(uVar71 + 0x48 + lVar69);
          auVar102 = vpminub_avx(auVar111,auVar102);
          auVar102 = vpcmpeqb_avx(auVar111,auVar102);
          auVar101._8_8_ = 0;
          auVar101._0_8_ = *(ulong *)(uVar71 + 0x44 + lVar69);
          auVar118._8_8_ = 0;
          auVar118._0_8_ = *(ulong *)(uVar71 + 0x4c + lVar69);
          auVar111 = vpminub_avx(auVar101,auVar118);
          fVar95 = *(float *)(uVar71 + 0x70 + lVar69);
          auVar111 = vpcmpeqb_avx(auVar101,auVar111);
          fVar96 = *(float *)(uVar71 + 0x7c + lVar69);
          auVar110._8_8_ = 0;
          auVar110._0_8_ = *(ulong *)(local_1638 + 0x40 + local_1608);
          auVar101 = vpmovzxbd_avx(auVar110);
          auVar128._8_8_ = 0;
          auVar128._0_8_ = *(ulong *)(local_1638 + 0x44 + local_1608);
          auVar110 = vpmovzxbd_avx(auVar128);
          auVar114._16_16_ = auVar110;
          auVar114._0_16_ = auVar101;
          auVar104 = vcvtdq2ps_avx(auVar114);
          auVar115._0_4_ = fVar95 + fVar96 * auVar104._0_4_;
          auVar115._4_4_ = fVar95 + fVar96 * auVar104._4_4_;
          auVar115._8_4_ = fVar95 + fVar96 * auVar104._8_4_;
          auVar115._12_4_ = fVar95 + fVar96 * auVar104._12_4_;
          auVar115._16_4_ = fVar95 + fVar96 * auVar104._16_4_;
          auVar115._20_4_ = fVar95 + fVar96 * auVar104._20_4_;
          auVar115._24_4_ = fVar95 + fVar96 * auVar104._24_4_;
          auVar115._28_4_ = fVar95 + auVar104._28_4_;
          auVar129._8_8_ = 0;
          auVar129._0_8_ = *(ulong *)(local_1640 + 0x40 + local_1608);
          auVar101 = vpmovzxbd_avx(auVar129);
          auVar134._8_8_ = 0;
          auVar134._0_8_ = *(ulong *)(local_1640 + 0x44 + local_1608);
          auVar110 = vpmovzxbd_avx(auVar134);
          auVar130._16_16_ = auVar110;
          auVar130._0_16_ = auVar101;
          auVar104 = vcvtdq2ps_avx(auVar130);
          fVar98 = *(float *)(uVar71 + 0x74 + lVar69);
          auVar120._0_4_ = fVar95 + fVar96 * auVar104._0_4_;
          auVar120._4_4_ = fVar95 + fVar96 * auVar104._4_4_;
          auVar120._8_4_ = fVar95 + fVar96 * auVar104._8_4_;
          auVar120._12_4_ = fVar95 + fVar96 * auVar104._12_4_;
          auVar120._16_4_ = fVar95 + fVar96 * auVar104._16_4_;
          auVar120._20_4_ = fVar95 + fVar96 * auVar104._20_4_;
          auVar120._24_4_ = fVar95 + fVar96 * auVar104._24_4_;
          auVar120._28_4_ = fVar95 + fVar96;
          fVar95 = *(float *)(uVar71 + 0x80 + lVar69);
          auVar123._8_8_ = 0;
          auVar123._0_8_ = *(ulong *)(local_1648 + 0x40 + local_1608);
          auVar101 = vpmovzxbd_avx(auVar123);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = *(ulong *)(local_1648 + 0x44 + local_1608);
          auVar110 = vpmovzxbd_avx(auVar139);
          auVar124._16_16_ = auVar110;
          auVar124._0_16_ = auVar101;
          auVar104 = vcvtdq2ps_avx(auVar124);
          auVar125._0_4_ = fVar98 + fVar95 * auVar104._0_4_;
          auVar125._4_4_ = fVar98 + fVar95 * auVar104._4_4_;
          auVar125._8_4_ = fVar98 + fVar95 * auVar104._8_4_;
          auVar125._12_4_ = fVar98 + fVar95 * auVar104._12_4_;
          auVar125._16_4_ = fVar98 + fVar95 * auVar104._16_4_;
          auVar125._20_4_ = fVar98 + fVar95 * auVar104._20_4_;
          auVar125._24_4_ = fVar98 + fVar95 * auVar104._24_4_;
          auVar125._28_4_ = fVar98 + auVar104._28_4_;
          auVar140._8_8_ = 0;
          auVar140._0_8_ = *(ulong *)(local_1650 + 0x40 + local_1608);
          auVar101 = vpmovzxbd_avx(auVar140);
          auVar150._8_8_ = 0;
          auVar150._0_8_ = *(ulong *)(local_1650 + 0x44 + local_1608);
          auVar110 = vpmovzxbd_avx(auVar150);
          auVar142._16_16_ = auVar110;
          auVar142._0_16_ = auVar101;
          auVar104 = vcvtdq2ps_avx(auVar142);
          fVar96 = *(float *)(uVar71 + 0x78 + lVar69);
          auVar131._0_4_ = fVar98 + fVar95 * auVar104._0_4_;
          auVar131._4_4_ = fVar98 + fVar95 * auVar104._4_4_;
          auVar131._8_4_ = fVar98 + fVar95 * auVar104._8_4_;
          auVar131._12_4_ = fVar98 + fVar95 * auVar104._12_4_;
          auVar131._16_4_ = fVar98 + fVar95 * auVar104._16_4_;
          auVar131._20_4_ = fVar98 + fVar95 * auVar104._20_4_;
          auVar131._24_4_ = fVar98 + fVar95 * auVar104._24_4_;
          auVar131._28_4_ = fVar98 + fVar95;
          fVar95 = *(float *)(uVar71 + 0x84 + lVar69);
          auVar151._8_8_ = 0;
          auVar151._0_8_ = *(ulong *)(local_1658 + 0x40 + local_1608);
          auVar101 = vpmovzxbd_avx(auVar151);
          auVar158._8_8_ = 0;
          auVar158._0_8_ = *(ulong *)(local_1658 + 0x44 + local_1608);
          auVar110 = vpmovzxbd_avx(auVar158);
          auVar152._16_16_ = auVar110;
          auVar152._0_16_ = auVar101;
          auVar159._8_8_ = 0;
          auVar159._0_8_ = *(ulong *)(local_1660 + 0x40 + local_1608);
          auVar101 = vpmovzxbd_avx(auVar159);
          auVar175._8_8_ = 0;
          auVar175._0_8_ = *(ulong *)(local_1660 + 0x44 + local_1608);
          auVar110 = vpmovzxbd_avx(auVar175);
          auVar160._16_16_ = auVar110;
          auVar160._0_16_ = auVar101;
          auVar104 = vcvtdq2ps_avx(auVar152);
          auVar113 = vcvtdq2ps_avx(auVar160);
          auVar153._0_4_ = auVar104._0_4_ * fVar95 + fVar96;
          auVar153._4_4_ = auVar104._4_4_ * fVar95 + fVar96;
          auVar153._8_4_ = auVar104._8_4_ * fVar95 + fVar96;
          auVar153._12_4_ = auVar104._12_4_ * fVar95 + fVar96;
          auVar153._16_4_ = auVar104._16_4_ * fVar95 + fVar96;
          auVar153._20_4_ = auVar104._20_4_ * fVar95 + fVar96;
          auVar153._24_4_ = auVar104._24_4_ * fVar95 + fVar96;
          auVar153._28_4_ = auVar104._28_4_ + fVar96;
          auVar135._0_4_ = fVar96 + auVar113._0_4_ * fVar95;
          auVar135._4_4_ = fVar96 + auVar113._4_4_ * fVar95;
          auVar135._8_4_ = fVar96 + auVar113._8_4_ * fVar95;
          auVar135._12_4_ = fVar96 + auVar113._12_4_ * fVar95;
          auVar135._16_4_ = fVar96 + auVar113._16_4_ * fVar95;
          auVar135._20_4_ = fVar96 + auVar113._20_4_ * fVar95;
          auVar135._24_4_ = fVar96 + auVar113._24_4_ * fVar95;
          auVar135._28_4_ = fVar96 + fVar95;
          auVar104 = vsubps_avx(auVar115,auVar185._0_32_);
          auVar44._4_4_ = fVar197 * auVar104._4_4_;
          auVar44._0_4_ = fVar90 * auVar104._0_4_;
          auVar44._8_4_ = fVar198 * auVar104._8_4_;
          auVar44._12_4_ = fVar199 * auVar104._12_4_;
          auVar44._16_4_ = fVar200 * auVar104._16_4_;
          auVar44._20_4_ = fVar201 * auVar104._20_4_;
          auVar44._24_4_ = fVar202 * auVar104._24_4_;
          auVar44._28_4_ = auVar104._28_4_;
          auVar104 = vsubps_avx(auVar125,auVar193._0_32_);
          auVar45._4_4_ = fVar205 * auVar104._4_4_;
          auVar45._0_4_ = fVar94 * auVar104._0_4_;
          auVar45._8_4_ = fVar207 * auVar104._8_4_;
          auVar45._12_4_ = fVar209 * auVar104._12_4_;
          auVar45._16_4_ = fVar211 * auVar104._16_4_;
          auVar45._20_4_ = fVar213 * auVar104._20_4_;
          auVar45._24_4_ = fVar215 * auVar104._24_4_;
          auVar45._28_4_ = auVar104._28_4_;
          auVar104 = vmaxps_avx(auVar44,auVar45);
          auVar113 = vsubps_avx(auVar120,auVar185._0_32_);
          auVar46._4_4_ = fVar197 * auVar113._4_4_;
          auVar46._0_4_ = fVar90 * auVar113._0_4_;
          auVar46._8_4_ = fVar198 * auVar113._8_4_;
          auVar46._12_4_ = fVar199 * auVar113._12_4_;
          auVar46._16_4_ = fVar200 * auVar113._16_4_;
          auVar46._20_4_ = fVar201 * auVar113._20_4_;
          auVar46._24_4_ = fVar202 * auVar113._24_4_;
          auVar46._28_4_ = auVar113._28_4_;
          auVar113 = vsubps_avx(auVar131,auVar193._0_32_);
          auVar47._4_4_ = fVar205 * auVar113._4_4_;
          auVar47._0_4_ = fVar94 * auVar113._0_4_;
          auVar47._8_4_ = fVar207 * auVar113._8_4_;
          auVar47._12_4_ = fVar209 * auVar113._12_4_;
          auVar47._16_4_ = fVar211 * auVar113._16_4_;
          auVar47._20_4_ = fVar213 * auVar113._20_4_;
          auVar47._24_4_ = fVar215 * auVar113._24_4_;
          auVar47._28_4_ = auVar113._28_4_;
          auVar7 = vminps_avx(auVar46,auVar47);
          auVar113 = vsubps_avx(auVar153,auVar195._0_32_);
          auVar48._4_4_ = fStack_147c * auVar113._4_4_;
          auVar48._0_4_ = local_1480 * auVar113._0_4_;
          auVar48._8_4_ = fStack_1478 * auVar113._8_4_;
          auVar48._12_4_ = fStack_1474 * auVar113._12_4_;
          auVar48._16_4_ = fStack_1470 * auVar113._16_4_;
          auVar48._20_4_ = fStack_146c * auVar113._20_4_;
          auVar48._24_4_ = fStack_1468 * auVar113._24_4_;
          auVar48._28_4_ = auVar113._28_4_;
          auVar113 = vmaxps_avx(auVar48,local_14a0);
          auVar104 = vmaxps_avx(auVar104,auVar113);
          auVar113 = vsubps_avx(auVar135,auVar195._0_32_);
          auVar49._4_4_ = fStack_147c * auVar113._4_4_;
          auVar49._0_4_ = local_1480 * auVar113._0_4_;
          auVar49._8_4_ = fStack_1478 * auVar113._8_4_;
          auVar49._12_4_ = fStack_1474 * auVar113._12_4_;
          auVar49._16_4_ = fStack_1470 * auVar113._16_4_;
          auVar49._20_4_ = fStack_146c * auVar113._20_4_;
          auVar49._24_4_ = fStack_1468 * auVar113._24_4_;
          auVar49._28_4_ = auVar113._28_4_;
          auVar113 = vminps_avx(auVar49,local_14c0);
          auVar113 = vminps_avx(auVar7,auVar113);
          auVar104 = vcmpps_avx(auVar104,auVar113,2);
          auVar101 = vpcmpeqd_avx(auVar113._0_16_,auVar113._0_16_);
          auVar102 = vpmovsxbd_avx(auVar102 ^ auVar101);
          auVar111 = vpmovsxbd_avx(auVar111 ^ auVar101);
          auVar91._16_16_ = auVar111;
          auVar91._0_16_ = auVar102;
          auVar113 = vcvtdq2ps_avx(auVar91);
          auVar105._8_4_ = 0xbf800000;
          auVar105._0_8_ = 0xbf800000bf800000;
          auVar105._12_4_ = 0xbf800000;
          auVar105._16_4_ = 0xbf800000;
          auVar105._20_4_ = 0xbf800000;
          auVar105._24_4_ = 0xbf800000;
          auVar105._28_4_ = 0xbf800000;
          auVar113 = vcmpps_avx(auVar105,auVar113,1);
          auVar104 = vandps_avx(auVar104,auVar113);
          uVar68 = vmovmskps_avx(auVar104);
          if (uVar68 != 0) {
            uVar73 = (ulong)(uVar68 & 0xff);
            do {
              lVar69 = 0;
              if (uVar73 != 0) {
                for (; (uVar73 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
                }
              }
              uVar3 = *(ushort *)(local_1608 + lVar69 * 8);
              uVar4 = *(ushort *)(local_1608 + 2 + lVar69 * 8);
              local_1618 = (ulong)*(uint *)(local_1608 + 0x88);
              uVar68 = *(uint *)(local_1608 + 4 + lVar69 * 8);
              local_1620 = (ulong)uVar68;
              pGVar5 = (context->scene->geometries).items[local_1618].ptr;
              local_1610 = *(long *)&pGVar5->field_0x58;
              lVar76 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       local_1620;
              uVar77 = uVar3 & 0x7fff;
              uVar79 = uVar4 & 0x7fff;
              uVar157 = *(uint *)(local_1610 + 4 + lVar76);
              uVar82 = (ulong)uVar157;
              uVar81 = (ulong)(uVar157 * uVar79 + *(int *)(local_1610 + lVar76) + uVar77);
              p_Var6 = pGVar5[1].intersectionFilterN;
              lVar69 = *(long *)&pGVar5[1].time_range.upper;
              auVar102 = *(undefined1 (*) [16])(lVar69 + (long)p_Var6 * uVar81);
              auVar111 = *(undefined1 (*) [16])(lVar69 + (uVar81 + 1) * (long)p_Var6);
              auVar101 = *(undefined1 (*) [16])(lVar69 + (uVar81 + uVar82) * (long)p_Var6);
              lVar87 = uVar81 + uVar82 + 1;
              auVar110 = *(undefined1 (*) [16])(lVar69 + lVar87 * (long)p_Var6);
              uVar80 = (ulong)(-1 < (short)uVar3);
              auVar118 = *(undefined1 (*) [16])(lVar69 + (uVar81 + uVar80 + 1) * (long)p_Var6);
              lVar85 = uVar80 + lVar87;
              auVar123 = *(undefined1 (*) [16])(lVar69 + lVar85 * (long)p_Var6);
              uVar80 = 0;
              if (-1 < (short)uVar4) {
                uVar80 = uVar82;
              }
              lVar74 = (uVar81 + uVar82 + uVar80) * (long)p_Var6;
              auVar128 = *(undefined1 (*) [16])(lVar69 + lVar74);
              auVar129 = *(undefined1 (*) [16])(lVar69 + (lVar87 + uVar80) * (long)p_Var6);
              auVar134 = *(undefined1 (*) [16])(lVar69 + (uVar80 + lVar85) * (long)p_Var6);
              auVar140 = vunpcklps_avx(auVar102,auVar110);
              auVar102 = vunpckhps_avx(auVar102,auVar110);
              auVar150 = vunpcklps_avx(auVar111,auVar101);
              auVar139 = vunpckhps_avx(auVar111,auVar101);
              auVar139 = vunpcklps_avx(auVar102,auVar139);
              auVar151 = vunpcklps_avx(auVar140,auVar150);
              auVar102 = vunpckhps_avx(auVar140,auVar150);
              auVar140 = vunpcklps_avx(auVar111,auVar123);
              auVar111 = vunpckhps_avx(auVar111,auVar123);
              auVar150 = vunpcklps_avx(auVar118,auVar110);
              auVar118 = vunpckhps_avx(auVar118,auVar110);
              auVar158 = vunpcklps_avx(auVar111,auVar118);
              auVar159 = vunpcklps_avx(auVar140,auVar150);
              auVar111 = vunpckhps_avx(auVar140,auVar150);
              auVar140 = vunpcklps_avx(auVar110,auVar134);
              auVar118 = vunpckhps_avx(auVar110,auVar134);
              auVar134 = vunpcklps_avx(auVar123,auVar129);
              auVar123 = vunpckhps_avx(auVar123,auVar129);
              auVar123 = vunpcklps_avx(auVar118,auVar123);
              auVar150 = vunpcklps_avx(auVar140,auVar134);
              auVar118 = vunpckhps_avx(auVar140,auVar134);
              auVar134 = vunpcklps_avx(auVar101,auVar129);
              auVar101 = vunpckhps_avx(auVar101,auVar129);
              auVar129 = vunpcklps_avx(auVar110,auVar128);
              auVar110 = vunpckhps_avx(auVar110,auVar128);
              auVar110 = vunpcklps_avx(auVar101,auVar110);
              auVar128 = vunpcklps_avx(auVar134,auVar129);
              auVar101 = vunpckhps_avx(auVar134,auVar129);
              auVar126._16_16_ = auVar150;
              auVar126._0_16_ = auVar151;
              auVar132._16_16_ = auVar118;
              auVar132._0_16_ = auVar102;
              auVar143._16_16_ = auVar123;
              auVar143._0_16_ = auVar139;
              auVar121._16_16_ = auVar159;
              auVar121._0_16_ = auVar159;
              auVar154._16_16_ = auVar111;
              auVar154._0_16_ = auVar111;
              auVar116._16_16_ = auVar158;
              auVar116._0_16_ = auVar158;
              auVar106._16_16_ = auVar128;
              auVar106._0_16_ = auVar128;
              auVar176._16_16_ = auVar101;
              auVar176._0_16_ = auVar101;
              auVar184._16_16_ = auVar110;
              auVar184._0_16_ = auVar110;
              auVar104 = vsubps_avx(auVar126,auVar121);
              auVar113 = vsubps_avx(auVar132,auVar154);
              auVar7 = vsubps_avx(auVar143,auVar116);
              auVar39 = vsubps_avx(auVar106,auVar126);
              auVar40 = vsubps_avx(auVar176,auVar132);
              auVar41 = vsubps_avx(auVar184,auVar143);
              fVar96 = auVar113._0_4_;
              fVar183 = auVar41._0_4_;
              fVar198 = auVar113._4_4_;
              fVar186 = auVar41._4_4_;
              auVar50._4_4_ = fVar186 * fVar198;
              auVar50._0_4_ = fVar183 * fVar96;
              fVar209 = auVar113._8_4_;
              fVar187 = auVar41._8_4_;
              auVar50._8_4_ = fVar187 * fVar209;
              fVar11 = auVar113._12_4_;
              fVar188 = auVar41._12_4_;
              auVar50._12_4_ = fVar188 * fVar11;
              fVar18 = auVar113._16_4_;
              fVar189 = auVar41._16_4_;
              auVar50._16_4_ = fVar189 * fVar18;
              fVar25 = auVar113._20_4_;
              fVar190 = auVar41._20_4_;
              auVar50._20_4_ = fVar190 * fVar25;
              fVar32 = auVar113._24_4_;
              fVar191 = auVar41._24_4_;
              auVar50._24_4_ = fVar191 * fVar32;
              auVar50._28_4_ = auVar128._12_4_;
              fVar98 = auVar7._0_4_;
              fVar174 = auVar40._0_4_;
              fVar199 = auVar7._4_4_;
              fVar177 = auVar40._4_4_;
              auVar52._4_4_ = fVar177 * fVar199;
              auVar52._0_4_ = fVar174 * fVar98;
              fVar211 = auVar7._8_4_;
              fVar178 = auVar40._8_4_;
              auVar52._8_4_ = fVar178 * fVar211;
              fVar12 = auVar7._12_4_;
              fVar179 = auVar40._12_4_;
              auVar52._12_4_ = fVar179 * fVar12;
              fVar19 = auVar7._16_4_;
              fVar180 = auVar40._16_4_;
              auVar52._16_4_ = fVar180 * fVar19;
              fVar26 = auVar7._20_4_;
              fVar181 = auVar40._20_4_;
              auVar52._20_4_ = fVar181 * fVar26;
              fVar33 = auVar7._24_4_;
              uVar51 = auVar158._12_4_;
              fVar182 = auVar40._24_4_;
              auVar52._24_4_ = fVar182 * fVar33;
              auVar52._28_4_ = uVar51;
              auVar7 = vsubps_avx(auVar52,auVar50);
              fVar156 = auVar39._0_4_;
              fVar161 = auVar39._4_4_;
              auVar53._4_4_ = fVar161 * fVar199;
              auVar53._0_4_ = fVar156 * fVar98;
              fVar163 = auVar39._8_4_;
              auVar53._8_4_ = fVar163 * fVar211;
              fVar165 = auVar39._12_4_;
              auVar53._12_4_ = fVar165 * fVar12;
              fVar167 = auVar39._16_4_;
              auVar53._16_4_ = fVar167 * fVar19;
              fVar169 = auVar39._20_4_;
              auVar53._20_4_ = fVar169 * fVar26;
              fVar171 = auVar39._24_4_;
              auVar53._24_4_ = fVar171 * fVar33;
              auVar53._28_4_ = uVar51;
              fVar100 = auVar104._0_4_;
              fVar200 = auVar104._4_4_;
              auVar55._4_4_ = fVar186 * fVar200;
              auVar55._0_4_ = fVar183 * fVar100;
              fVar213 = auVar104._8_4_;
              auVar55._8_4_ = fVar187 * fVar213;
              fVar13 = auVar104._12_4_;
              auVar55._12_4_ = fVar188 * fVar13;
              fVar20 = auVar104._16_4_;
              auVar55._16_4_ = fVar189 * fVar20;
              fVar27 = auVar104._20_4_;
              auVar55._20_4_ = fVar190 * fVar27;
              fVar34 = auVar104._24_4_;
              uVar54 = auVar159._12_4_;
              auVar55._24_4_ = fVar191 * fVar34;
              auVar55._28_4_ = uVar54;
              auVar42 = vsubps_avx(auVar55,auVar53);
              auVar56._4_4_ = fVar177 * fVar200;
              auVar56._0_4_ = fVar174 * fVar100;
              auVar56._8_4_ = fVar178 * fVar213;
              auVar56._12_4_ = fVar179 * fVar13;
              auVar56._16_4_ = fVar180 * fVar20;
              auVar56._20_4_ = fVar181 * fVar27;
              auVar56._24_4_ = fVar182 * fVar34;
              auVar56._28_4_ = uVar54;
              auVar192._0_4_ = fVar156 * fVar96;
              auVar192._4_4_ = fVar161 * fVar198;
              auVar192._8_4_ = fVar163 * fVar209;
              auVar192._12_4_ = fVar165 * fVar11;
              auVar192._16_4_ = fVar167 * fVar18;
              auVar192._20_4_ = fVar169 * fVar25;
              auVar192._24_4_ = fVar171 * fVar32;
              auVar192._28_4_ = 0;
              uVar84 = *(undefined4 *)(ray + k * 4);
              auVar194._4_4_ = uVar84;
              auVar194._0_4_ = uVar84;
              auVar194._8_4_ = uVar84;
              auVar194._12_4_ = uVar84;
              auVar194._16_4_ = uVar84;
              auVar194._20_4_ = uVar84;
              auVar194._24_4_ = uVar84;
              auVar194._28_4_ = uVar84;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
              auVar196._4_4_ = uVar1;
              auVar196._0_4_ = uVar1;
              auVar196._8_4_ = uVar1;
              auVar196._12_4_ = uVar1;
              auVar196._16_4_ = uVar1;
              auVar196._20_4_ = uVar1;
              auVar196._24_4_ = uVar1;
              auVar196._28_4_ = uVar1;
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
              auVar204._4_4_ = uVar2;
              auVar204._0_4_ = uVar2;
              auVar204._8_4_ = uVar2;
              auVar204._12_4_ = uVar2;
              auVar204._16_4_ = uVar2;
              auVar204._20_4_ = uVar2;
              auVar204._24_4_ = uVar2;
              auVar204._28_4_ = uVar2;
              fVar90 = *(float *)(ray + k * 4 + 0x50);
              auVar43 = vsubps_avx(auVar192,auVar56);
              auVar104 = vsubps_avx(auVar126,auVar194);
              fVar94 = *(float *)(ray + k * 4 + 0x60);
              auVar113 = vsubps_avx(auVar132,auVar196);
              auVar44 = vsubps_avx(auVar143,auVar204);
              fVar138 = auVar44._0_4_;
              fVar144 = auVar44._4_4_;
              auVar57._4_4_ = fVar144 * fVar90;
              auVar57._0_4_ = fVar138 * fVar90;
              fVar145 = auVar44._8_4_;
              auVar57._8_4_ = fVar145 * fVar90;
              fVar146 = auVar44._12_4_;
              auVar57._12_4_ = fVar146 * fVar90;
              fVar147 = auVar44._16_4_;
              auVar57._16_4_ = fVar147 * fVar90;
              fVar148 = auVar44._20_4_;
              auVar57._20_4_ = fVar148 * fVar90;
              fVar149 = auVar44._24_4_;
              auVar57._24_4_ = fVar149 * fVar90;
              auVar57._28_4_ = uVar84;
              fVar97 = auVar113._0_4_;
              fVar201 = auVar113._4_4_;
              auVar58._4_4_ = fVar94 * fVar201;
              auVar58._0_4_ = fVar94 * fVar97;
              fVar215 = auVar113._8_4_;
              auVar58._8_4_ = fVar94 * fVar215;
              fVar14 = auVar113._12_4_;
              auVar58._12_4_ = fVar94 * fVar14;
              fVar21 = auVar113._16_4_;
              auVar58._16_4_ = fVar94 * fVar21;
              fVar28 = auVar113._20_4_;
              auVar58._20_4_ = fVar94 * fVar28;
              fVar35 = auVar113._24_4_;
              auVar58._24_4_ = fVar94 * fVar35;
              auVar58._28_4_ = uVar1;
              auVar113 = vsubps_avx(auVar58,auVar57);
              fVar95 = *(float *)(ray + k * 4 + 0x40);
              fVar99 = auVar104._0_4_;
              fVar202 = auVar104._4_4_;
              auVar59._4_4_ = fVar94 * fVar202;
              auVar59._0_4_ = fVar94 * fVar99;
              fVar8 = auVar104._8_4_;
              auVar59._8_4_ = fVar94 * fVar8;
              fVar15 = auVar104._12_4_;
              auVar59._12_4_ = fVar94 * fVar15;
              fVar22 = auVar104._16_4_;
              auVar59._16_4_ = fVar94 * fVar22;
              fVar29 = auVar104._20_4_;
              auVar59._20_4_ = fVar94 * fVar29;
              fVar36 = auVar104._24_4_;
              auVar59._24_4_ = fVar94 * fVar36;
              auVar59._28_4_ = uVar2;
              auVar60._4_4_ = fVar95 * fVar144;
              auVar60._0_4_ = fVar95 * fVar138;
              auVar60._8_4_ = fVar95 * fVar145;
              auVar60._12_4_ = fVar95 * fVar146;
              auVar60._16_4_ = fVar95 * fVar147;
              auVar60._20_4_ = fVar95 * fVar148;
              auVar60._24_4_ = fVar95 * fVar149;
              auVar60._28_4_ = uVar51;
              auVar45 = vsubps_avx(auVar60,auVar59);
              auVar61._4_4_ = fVar95 * fVar201;
              auVar61._0_4_ = fVar95 * fVar97;
              auVar61._8_4_ = fVar95 * fVar215;
              auVar61._12_4_ = fVar95 * fVar14;
              auVar61._16_4_ = fVar95 * fVar21;
              auVar61._20_4_ = fVar95 * fVar28;
              auVar61._24_4_ = fVar95 * fVar35;
              auVar61._28_4_ = uVar2;
              auVar62._4_4_ = fVar202 * fVar90;
              auVar62._0_4_ = fVar99 * fVar90;
              auVar62._8_4_ = fVar8 * fVar90;
              auVar62._12_4_ = fVar15 * fVar90;
              auVar62._16_4_ = fVar22 * fVar90;
              auVar62._20_4_ = fVar29 * fVar90;
              auVar62._24_4_ = fVar36 * fVar90;
              auVar62._28_4_ = uVar54;
              auVar46 = vsubps_avx(auVar62,auVar61);
              fVar93 = auVar43._0_4_;
              fVar205 = auVar43._4_4_;
              fVar9 = auVar43._8_4_;
              fVar16 = auVar43._12_4_;
              fVar23 = auVar43._16_4_;
              fVar30 = auVar43._20_4_;
              fVar37 = auVar43._24_4_;
              fVar203 = auVar42._0_4_;
              fVar206 = auVar42._4_4_;
              fVar208 = auVar42._8_4_;
              fVar210 = auVar42._12_4_;
              fVar212 = auVar42._16_4_;
              fVar214 = auVar42._20_4_;
              fVar216 = auVar42._24_4_;
              fVar197 = auVar7._0_4_;
              fVar207 = auVar7._4_4_;
              fVar10 = auVar7._8_4_;
              fVar17 = auVar7._12_4_;
              fVar24 = auVar7._16_4_;
              fVar31 = auVar7._20_4_;
              fVar38 = auVar7._24_4_;
              auVar107._0_4_ = fVar95 * fVar197 + fVar94 * fVar93 + fVar203 * fVar90;
              auVar107._4_4_ = fVar95 * fVar207 + fVar94 * fVar205 + fVar206 * fVar90;
              auVar107._8_4_ = fVar95 * fVar10 + fVar94 * fVar9 + fVar208 * fVar90;
              auVar107._12_4_ = fVar95 * fVar17 + fVar94 * fVar16 + fVar210 * fVar90;
              auVar107._16_4_ = fVar95 * fVar24 + fVar94 * fVar23 + fVar212 * fVar90;
              auVar107._20_4_ = fVar95 * fVar31 + fVar94 * fVar30 + fVar214 * fVar90;
              auVar107._24_4_ = fVar95 * fVar38 + fVar94 * fVar37 + fVar216 * fVar90;
              auVar107._28_4_ = fVar94 + fVar94 + fVar90;
              auVar122._8_4_ = 0x80000000;
              auVar122._0_8_ = 0x8000000080000000;
              auVar122._12_4_ = 0x80000000;
              auVar122._16_4_ = 0x80000000;
              auVar122._20_4_ = 0x80000000;
              auVar122._24_4_ = 0x80000000;
              auVar122._28_4_ = 0x80000000;
              auVar104 = vandps_avx(auVar107,auVar122);
              uVar157 = auVar104._0_4_;
              auVar136._0_4_ =
                   (float)(uVar157 ^
                          (uint)(fVar156 * auVar113._0_4_ +
                                fVar183 * auVar46._0_4_ + fVar174 * auVar45._0_4_));
              uVar162 = auVar104._4_4_;
              auVar136._4_4_ =
                   (float)(uVar162 ^
                          (uint)(fVar161 * auVar113._4_4_ +
                                fVar186 * auVar46._4_4_ + fVar177 * auVar45._4_4_));
              uVar164 = auVar104._8_4_;
              auVar136._8_4_ =
                   (float)(uVar164 ^
                          (uint)(fVar163 * auVar113._8_4_ +
                                fVar187 * auVar46._8_4_ + fVar178 * auVar45._8_4_));
              uVar166 = auVar104._12_4_;
              auVar136._12_4_ =
                   (float)(uVar166 ^
                          (uint)(fVar165 * auVar113._12_4_ +
                                fVar188 * auVar46._12_4_ + fVar179 * auVar45._12_4_));
              uVar168 = auVar104._16_4_;
              auVar136._16_4_ =
                   (float)(uVar168 ^
                          (uint)(fVar167 * auVar113._16_4_ +
                                fVar189 * auVar46._16_4_ + fVar180 * auVar45._16_4_));
              uVar170 = auVar104._20_4_;
              auVar136._20_4_ =
                   (float)(uVar170 ^
                          (uint)(fVar169 * auVar113._20_4_ +
                                fVar190 * auVar46._20_4_ + fVar181 * auVar45._20_4_));
              uVar172 = auVar104._24_4_;
              auVar136._24_4_ =
                   (float)(uVar172 ^
                          (uint)(fVar171 * auVar113._24_4_ +
                                fVar191 * auVar46._24_4_ + fVar182 * auVar45._24_4_));
              uVar173 = auVar104._28_4_;
              auVar136._28_4_ =
                   (float)(uVar173 ^ (uint)(auVar39._28_4_ + auVar41._28_4_ + auVar40._28_4_));
              auVar155._0_4_ =
                   (float)(uVar157 ^
                          (uint)(auVar113._0_4_ * fVar100 +
                                fVar98 * auVar46._0_4_ + fVar96 * auVar45._0_4_));
              auVar155._4_4_ =
                   (float)(uVar162 ^
                          (uint)(auVar113._4_4_ * fVar200 +
                                fVar199 * auVar46._4_4_ + fVar198 * auVar45._4_4_));
              auVar155._8_4_ =
                   (float)(uVar164 ^
                          (uint)(auVar113._8_4_ * fVar213 +
                                fVar211 * auVar46._8_4_ + fVar209 * auVar45._8_4_));
              auVar155._12_4_ =
                   (float)(uVar166 ^
                          (uint)(auVar113._12_4_ * fVar13 +
                                fVar12 * auVar46._12_4_ + fVar11 * auVar45._12_4_));
              auVar155._16_4_ =
                   (float)(uVar168 ^
                          (uint)(auVar113._16_4_ * fVar20 +
                                fVar19 * auVar46._16_4_ + fVar18 * auVar45._16_4_));
              auVar155._20_4_ =
                   (float)(uVar170 ^
                          (uint)(auVar113._20_4_ * fVar27 +
                                fVar26 * auVar46._20_4_ + fVar25 * auVar45._20_4_));
              auVar155._24_4_ =
                   (float)(uVar172 ^
                          (uint)(auVar113._24_4_ * fVar34 +
                                fVar33 * auVar46._24_4_ + fVar32 * auVar45._24_4_));
              auVar155._28_4_ =
                   (float)(uVar173 ^ (uint)(auVar7._28_4_ + auVar46._28_4_ + auVar45._28_4_));
              auVar113 = ZEXT1232(ZEXT812(0)) << 0x20;
              auVar104 = vcmpps_avx(auVar136,auVar113,5);
              auVar113 = vcmpps_avx(auVar155,auVar113,5);
              auVar104 = vandps_avx(auVar104,auVar113);
              auVar92._8_4_ = 0x7fffffff;
              auVar92._0_8_ = 0x7fffffff7fffffff;
              auVar92._12_4_ = 0x7fffffff;
              auVar92._16_4_ = 0x7fffffff;
              auVar92._20_4_ = 0x7fffffff;
              auVar92._24_4_ = 0x7fffffff;
              auVar92._28_4_ = 0x7fffffff;
              local_1360 = vandps_avx(auVar107,auVar92);
              auVar113 = vcmpps_avx(auVar107,ZEXT1232(ZEXT812(0)) << 0x20,4);
              auVar104 = vandps_avx(auVar104,auVar113);
              auVar108._0_4_ = auVar155._0_4_ + auVar136._0_4_;
              auVar108._4_4_ = auVar155._4_4_ + auVar136._4_4_;
              auVar108._8_4_ = auVar155._8_4_ + auVar136._8_4_;
              auVar108._12_4_ = auVar155._12_4_ + auVar136._12_4_;
              auVar108._16_4_ = auVar155._16_4_ + auVar136._16_4_;
              auVar108._20_4_ = auVar155._20_4_ + auVar136._20_4_;
              auVar108._24_4_ = auVar155._24_4_ + auVar136._24_4_;
              auVar108._28_4_ = auVar155._28_4_ + auVar136._28_4_;
              auVar113 = vcmpps_avx(auVar108,local_1360,2);
              auVar39 = auVar113 & auVar104;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                auVar104 = vandps_avx(auVar104,auVar113);
                auVar102 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
                local_1380._0_4_ =
                     (float)(uVar157 ^
                            (uint)(fVar197 * fVar99 + fVar203 * fVar97 + fVar138 * fVar93));
                local_1380._4_4_ =
                     (float)(uVar162 ^
                            (uint)(fVar207 * fVar202 + fVar206 * fVar201 + fVar144 * fVar205));
                local_1380._8_4_ =
                     (float)(uVar164 ^ (uint)(fVar10 * fVar8 + fVar208 * fVar215 + fVar145 * fVar9))
                ;
                local_1380._12_4_ =
                     (float)(uVar166 ^ (uint)(fVar17 * fVar15 + fVar210 * fVar14 + fVar146 * fVar16)
                            );
                local_1380._16_4_ =
                     (float)(uVar168 ^ (uint)(fVar24 * fVar22 + fVar212 * fVar21 + fVar147 * fVar23)
                            );
                local_1380._20_4_ =
                     (float)(uVar170 ^ (uint)(fVar31 * fVar29 + fVar214 * fVar28 + fVar148 * fVar30)
                            );
                local_1380._24_4_ =
                     (float)(uVar172 ^ (uint)(fVar38 * fVar36 + fVar216 * fVar35 + fVar149 * fVar37)
                            );
                local_1380._28_4_ = uVar173;
                fVar90 = *(float *)(ray + k * 4 + 0x30);
                fVar94 = local_1360._0_4_;
                fVar95 = local_1360._4_4_;
                auVar63._4_4_ = fVar95 * fVar90;
                auVar63._0_4_ = fVar94 * fVar90;
                fVar96 = local_1360._8_4_;
                auVar63._8_4_ = fVar96 * fVar90;
                fVar98 = local_1360._12_4_;
                auVar63._12_4_ = fVar98 * fVar90;
                fVar100 = local_1360._16_4_;
                auVar63._16_4_ = fVar100 * fVar90;
                fVar97 = local_1360._20_4_;
                auVar63._20_4_ = fVar97 * fVar90;
                fVar99 = local_1360._24_4_;
                auVar63._24_4_ = fVar99 * fVar90;
                auVar63._28_4_ = fVar90;
                auVar104 = vcmpps_avx(auVar63,local_1380,1);
                fVar90 = *(float *)(ray + k * 4 + 0x80);
                auVar64._4_4_ = fVar95 * fVar90;
                auVar64._0_4_ = fVar94 * fVar90;
                auVar64._8_4_ = fVar96 * fVar90;
                auVar64._12_4_ = fVar98 * fVar90;
                auVar64._16_4_ = fVar100 * fVar90;
                auVar64._20_4_ = fVar97 * fVar90;
                auVar64._24_4_ = fVar99 * fVar90;
                auVar64._28_4_ = fVar90;
                auVar113 = vcmpps_avx(local_1380,auVar64,2);
                auVar104 = vandps_avx(auVar104,auVar113);
                auVar111 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
                auVar102 = vpand_avx(auVar111,auVar102);
                auVar111 = vpmovzxwd_avx(auVar102);
                auVar111 = vpslld_avx(auVar111,0x1f);
                auVar111 = vpsrad_avx(auVar111,0x1f);
                auVar102 = vpunpckhwd_avx(auVar102,auVar102);
                auVar102 = vpslld_avx(auVar102,0x1f);
                auVar102 = vpsrad_avx(auVar102,0x1f);
                local_1320._16_16_ = auVar102;
                local_1320._0_16_ = auVar111;
                if ((((((((local_1320 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (local_1320 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_1320 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(local_1320 >> 0x7f,0) != '\0') ||
                      (local_1320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB161(auVar102 >> 0x3f,0) != '\0') ||
                    (local_1320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar102[0xf] < '\0') {
                  auVar104 = vsubps_avx(local_1360,auVar155);
                  auVar104 = vblendvps_avx(auVar136,auVar104,local_1220);
                  auVar113 = vsubps_avx(local_1360,auVar136);
                  auVar113 = vblendvps_avx(auVar155,auVar113,local_1220);
                  local_12a0[0] = fVar197 * (float)local_1240._0_4_;
                  local_12a0[1] = fVar207 * (float)local_1240._4_4_;
                  local_12a0[2] = fVar10 * fStack_1238;
                  local_12a0[3] = fVar17 * fStack_1234;
                  fStack_1290 = fVar24 * fStack_1230;
                  fStack_128c = fVar31 * fStack_122c;
                  fStack_1288 = fVar38 * fStack_1228;
                  fStack_1284 = auVar155._28_4_;
                  local_1280[0] = fVar203 * (float)local_1240._0_4_;
                  local_1280[1] = fVar206 * (float)local_1240._4_4_;
                  local_1280[2] = fVar208 * fStack_1238;
                  local_1280[3] = fVar210 * fStack_1234;
                  fStack_1270 = fVar212 * fStack_1230;
                  fStack_126c = fVar214 * fStack_122c;
                  fStack_1268 = fVar216 * fStack_1228;
                  fStack_1264 = auVar155._28_4_;
                  local_1260[0] = (float)local_1240._0_4_ * fVar93;
                  local_1260[1] = (float)local_1240._4_4_ * fVar205;
                  local_1260[2] = fStack_1238 * fVar9;
                  local_1260[3] = fStack_1234 * fVar16;
                  fStack_1250 = fStack_1230 * fVar23;
                  fStack_124c = fStack_122c * fVar30;
                  fStack_1248 = fStack_1228 * fVar37;
                  fStack_1244 = auVar155._28_4_;
                  auVar102 = vpshufd_avx(ZEXT416(uVar77),0);
                  auVar102 = vpaddd_avx(auVar102,_DAT_0201c990);
                  auVar111 = vpshufd_avx(ZEXT416(uVar79),0);
                  auVar111 = vpaddd_avx(auVar111,_DAT_0201c9a0);
                  auVar119._0_4_ = (float)(int)(*(ushort *)(local_1610 + 8 + lVar76) - 1);
                  auVar141._4_12_ = auVar44._4_12_;
                  auVar119._4_12_ = auVar141._4_12_;
                  auVar101 = vrcpss_avx(auVar119,auVar119);
                  auVar141._0_4_ = (float)(int)(*(ushort *)(local_1610 + 10 + lVar76) - 1);
                  auVar110 = vrcpss_avx(auVar141,auVar141);
                  auVar109._16_16_ = auVar102;
                  auVar109._0_16_ = auVar102;
                  auVar39 = vcvtdq2ps_avx(auVar109);
                  fStack_13a4 = auVar39._28_4_ + auVar104._28_4_;
                  auVar102 = ZEXT416((uint)(auVar101._0_4_ * (2.0 - auVar101._0_4_ * auVar119._0_4_)
                                           ));
                  auVar102 = vshufps_avx(auVar102,auVar102,0);
                  local_13c0 = (fVar94 * auVar39._0_4_ + auVar104._0_4_) * auVar102._0_4_;
                  fStack_13bc = (fVar95 * auVar39._4_4_ + auVar104._4_4_) * auVar102._4_4_;
                  fStack_13b8 = (fVar96 * auVar39._8_4_ + auVar104._8_4_) * auVar102._8_4_;
                  fStack_13b4 = (fVar98 * auVar39._12_4_ + auVar104._12_4_) * auVar102._12_4_;
                  fStack_13b0 = (fVar100 * auVar39._16_4_ + auVar104._16_4_) * auVar102._0_4_;
                  fStack_13ac = (fVar97 * auVar39._20_4_ + auVar104._20_4_) * auVar102._4_4_;
                  fStack_13a8 = (fVar99 * auVar39._24_4_ + auVar104._24_4_) * auVar102._8_4_;
                  auVar117._16_16_ = auVar111;
                  auVar117._0_16_ = auVar111;
                  auVar104 = vcvtdq2ps_avx(auVar117);
                  auVar102 = ZEXT416((uint)(auVar110._0_4_ * (2.0 - auVar110._0_4_ * auVar141._0_4_)
                                           ));
                  auVar102 = vshufps_avx(auVar102,auVar102,0);
                  local_13a0 = (fVar94 * auVar104._0_4_ + auVar113._0_4_) * auVar102._0_4_;
                  fStack_139c = (fVar95 * auVar104._4_4_ + auVar113._4_4_) * auVar102._4_4_;
                  fStack_1398 = (fVar96 * auVar104._8_4_ + auVar113._8_4_) * auVar102._8_4_;
                  fStack_1394 = (fVar98 * auVar104._12_4_ + auVar113._12_4_) * auVar102._12_4_;
                  fStack_1390 = (fVar100 * auVar104._16_4_ + auVar113._16_4_) * auVar102._0_4_;
                  fStack_138c = (fVar97 * auVar104._20_4_ + auVar113._20_4_) * auVar102._4_4_;
                  fStack_1388 = (fVar99 * auVar104._24_4_ + auVar113._24_4_) * auVar102._8_4_;
                  fStack_1384 = auVar104._28_4_ + auVar113._28_4_;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar104 = vrcpps_avx(local_1360);
                      fVar90 = auVar104._0_4_;
                      fVar93 = auVar104._4_4_;
                      auVar65._4_4_ = fVar95 * fVar93;
                      auVar65._0_4_ = fVar94 * fVar90;
                      fVar94 = auVar104._8_4_;
                      auVar65._8_4_ = fVar96 * fVar94;
                      fVar95 = auVar104._12_4_;
                      auVar65._12_4_ = fVar98 * fVar95;
                      fVar96 = auVar104._16_4_;
                      auVar65._16_4_ = fVar100 * fVar96;
                      fVar98 = auVar104._20_4_;
                      auVar65._20_4_ = fVar97 * fVar98;
                      fVar100 = auVar104._24_4_;
                      auVar65._24_4_ = fVar99 * fVar100;
                      auVar65._28_4_ = local_1360._28_4_;
                      auVar127._8_4_ = 0x3f800000;
                      auVar127._0_8_ = &DAT_3f8000003f800000;
                      auVar127._12_4_ = 0x3f800000;
                      auVar127._16_4_ = 0x3f800000;
                      auVar127._20_4_ = 0x3f800000;
                      auVar127._24_4_ = 0x3f800000;
                      auVar127._28_4_ = 0x3f800000;
                      auVar113 = vsubps_avx(auVar127,auVar65);
                      fVar90 = fVar90 + fVar90 * auVar113._0_4_;
                      fVar93 = fVar93 + fVar93 * auVar113._4_4_;
                      fVar94 = fVar94 + fVar94 * auVar113._8_4_;
                      fVar95 = fVar95 + fVar95 * auVar113._12_4_;
                      fVar96 = fVar96 + fVar96 * auVar113._16_4_;
                      fVar98 = fVar98 + fVar98 * auVar113._20_4_;
                      fVar100 = fVar100 + fVar100 * auVar113._24_4_;
                      local_12c0[0] = fVar90 * local_1380._0_4_;
                      local_12c0[1] = fVar93 * local_1380._4_4_;
                      local_12c0[2] = fVar94 * local_1380._8_4_;
                      local_12c0[3] = fVar95 * local_1380._12_4_;
                      fStack_12b0 = fVar96 * local_1380._16_4_;
                      fStack_12ac = fVar98 * local_1380._20_4_;
                      fStack_12a8 = fVar100 * local_1380._24_4_;
                      fStack_12a4 = auVar104._28_4_;
                      local_1300[0] = local_13c0 * fVar90;
                      local_1300[1] = fStack_13bc * fVar93;
                      local_1300[2] = fStack_13b8 * fVar94;
                      local_1300[3] = fStack_13b4 * fVar95;
                      fStack_12f0 = fStack_13b0 * fVar96;
                      fStack_12ec = fStack_13ac * fVar98;
                      fStack_12e8 = fStack_13a8 * fVar100;
                      fStack_12e4 = fStack_13a4;
                      local_12e0[0] = local_13a0 * fVar90;
                      local_12e0[1] = fStack_139c * fVar93;
                      local_12e0[2] = fStack_1398 * fVar94;
                      local_12e0[3] = fStack_1394 * fVar95;
                      fStack_12d0 = fStack_1390 * fVar96;
                      fStack_12cc = fStack_138c * fVar98;
                      fStack_12c8 = fStack_1388 * fVar100;
                      fStack_12c4 = auVar104._28_4_ + auVar113._28_4_;
                      iVar72 = vmovmskps_avx(local_1320);
                      uVar81 = CONCAT44((int)((ulong)lVar74 >> 0x20),iVar72);
                      uVar80 = 0;
                      if (uVar81 != 0) {
                        for (; (uVar81 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
                        }
                      }
                      bVar89 = iVar72 != 0;
                      if (bVar89) {
                        local_1600 = vpshufd_avx(ZEXT416(*(uint *)(local_1608 + 0x88)),0);
                        auStack_15f0 = auVar7._16_16_;
                        local_14e0 = vpshufd_avx(ZEXT416(uVar68),0);
                        auStack_14d0 = auVar42._16_16_;
                        auStack_1590 = auVar43._16_16_;
                        local_15a0 = *local_16b0;
                        do {
                          uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_1420 = local_1300[uVar80];
                          local_1410 = local_12e0[uVar80];
                          *(float *)(ray + k * 4 + 0x80) = local_12c0[uVar80];
                          local_15d0.context = context->user;
                          local_1450 = local_12a0[uVar80];
                          local_1440 = local_1280[uVar80];
                          local_1430 = local_1260[uVar80];
                          local_1400 = local_14e0._0_8_;
                          uStack_13f8 = local_14e0._8_8_;
                          local_13f0 = local_1600;
                          vcmpps_avx(ZEXT1632(local_1600),ZEXT1632(local_1600),0xf);
                          uStack_13dc = (local_15d0.context)->instID[0];
                          local_13e0 = uStack_13dc;
                          uStack_13d8 = uStack_13dc;
                          uStack_13d4 = uStack_13dc;
                          uStack_13d0 = (local_15d0.context)->instPrimID[0];
                          uStack_13cc = uStack_13d0;
                          uStack_13c8 = uStack_13d0;
                          uStack_13c4 = uStack_13d0;
                          local_16c0 = local_15a0._0_8_;
                          uStack_16b8 = local_15a0._8_8_;
                          local_15d0.valid = (int *)&local_16c0;
                          local_15d0.geometryUserPtr = pGVar5->userPtr;
                          local_15d0.hit = (RTCHitN *)&local_1450;
                          local_15d0.N = 4;
                          local_15d0.ray = (RTCRayN *)ray;
                          fStack_144c = local_1450;
                          fStack_1448 = local_1450;
                          fStack_1444 = local_1450;
                          fStack_143c = local_1440;
                          fStack_1438 = local_1440;
                          fStack_1434 = local_1440;
                          fStack_142c = local_1430;
                          fStack_1428 = local_1430;
                          fStack_1424 = local_1430;
                          fStack_141c = local_1420;
                          fStack_1418 = local_1420;
                          fStack_1414 = local_1420;
                          fStack_140c = local_1410;
                          fStack_1408 = local_1410;
                          fStack_1404 = local_1410;
                          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar5->occlusionFilterN)(&local_15d0);
                          }
                          auVar66._8_8_ = uStack_16b8;
                          auVar66._0_8_ = local_16c0;
                          if (auVar66 == (undefined1  [16])0x0) {
                            auVar102 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar102 = auVar102 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var6)(&local_15d0);
                            }
                            auVar67._8_8_ = uStack_16b8;
                            auVar67._0_8_ = local_16c0;
                            auVar111 = vpcmpeqd_avx((undefined1  [16])0x0,auVar67);
                            auVar102 = auVar111 ^ _DAT_01febe20;
                            auVar112._8_4_ = 0xff800000;
                            auVar112._0_8_ = 0xff800000ff800000;
                            auVar112._12_4_ = 0xff800000;
                            auVar111 = vblendvps_avx(auVar112,*(undefined1 (*) [16])
                                                               (local_15d0.ray + 0x80),auVar111);
                            *(undefined1 (*) [16])(local_15d0.ray + 0x80) = auVar111;
                          }
                          auVar103._8_8_ = 0x100000001;
                          auVar103._0_8_ = 0x100000001;
                          if ((auVar103 & auVar102) != (undefined1  [16])0x0) break;
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar84;
                          uVar81 = uVar81 ^ 1L << (uVar80 & 0x3f);
                          uVar80 = 0;
                          if (uVar81 != 0) {
                            for (; (uVar81 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
                            }
                          }
                          bVar89 = uVar81 != 0;
                        } while (bVar89);
                      }
                      if (!bVar89) goto LAB_00472293;
                    }
                    auVar185 = ZEXT3264(local_1500);
                    auVar193 = ZEXT3264(local_1520);
                    auVar195 = ZEXT3264(local_1540);
                    fVar90 = local_1560;
                    fVar197 = fStack_155c;
                    fVar198 = fStack_1558;
                    fVar199 = fStack_1554;
                    fVar200 = fStack_1550;
                    fVar201 = fStack_154c;
                    fVar202 = fStack_1548;
                    fVar94 = local_1580;
                    fVar205 = fStack_157c;
                    fVar207 = fStack_1578;
                    fVar209 = fStack_1574;
                    fVar211 = fStack_1570;
                    fVar213 = fStack_156c;
                    fVar215 = fStack_1568;
                    goto LAB_004727ea;
                  }
                }
              }
LAB_00472293:
              uVar73 = uVar73 & uVar73 - 1;
            } while (uVar73 != 0);
          }
          local_1628 = local_1628 + 1;
          bVar88 = local_1628 < local_1630;
          auVar185 = ZEXT3264(local_1500);
          auVar193 = ZEXT3264(local_1520);
          auVar195 = ZEXT3264(local_1540);
          fVar90 = local_1560;
          fVar197 = fStack_155c;
          fVar198 = fStack_1558;
          fVar199 = fStack_1554;
          fVar200 = fStack_1550;
          fVar201 = fStack_154c;
          fVar202 = fStack_1548;
          fVar94 = local_1580;
          fVar205 = fStack_157c;
          fVar207 = fStack_1578;
          fVar209 = fStack_1574;
          fVar211 = fStack_1570;
          fVar213 = fStack_156c;
          fVar215 = fStack_1568;
        } while (local_1628 != local_1630);
      }
LAB_004727ea:
      uVar68 = 0;
      auVar133 = ZEXT3264(local_14a0);
      auVar137 = ZEXT3264(local_14c0);
      uVar73 = local_16a0;
      uVar80 = local_1680;
      uVar81 = local_1688;
      uVar82 = local_1690;
      uVar83 = local_1698;
      uVar86 = local_16a8;
      fVar95 = local_1480;
      fVar96 = fStack_147c;
      fVar98 = fStack_1478;
      fVar100 = fStack_1474;
      fVar97 = fStack_1470;
      fVar99 = fStack_146c;
      fVar93 = fStack_1468;
      if (bVar88) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar68 = 1;
      }
    }
    puVar78 = local_1668;
    unaff_R13 = local_1678;
  } while ((uVar68 & 3) == 0);
  return local_1670 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }